

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

int AF_AActor_RoughMonsterSearch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  bool bVar2;
  AActor *pAVar3;
  int iVar4;
  char *pcVar5;
  
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_00423d25;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_00423d15:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_00423d25:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x77a,
                  "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  pAVar3 = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (pAVar3 == (AActor *)0x0) goto LAB_00423c5c;
    bVar2 = DObject::IsKindOf((DObject *)pAVar3,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_00423d25;
    }
  }
  else {
    if (pAVar3 != (AActor *)0x0) goto LAB_00423d15;
LAB_00423c5c:
    pAVar3 = (AActor *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
LAB_00423d4d:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                  ,0x77b,
                  "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar5 = "param[paramnum].Type == REGT_INT";
    goto LAB_00423d4d;
  }
  pVVar1 = param + 1;
  if ((uint)numparam < 3) {
    param = defaultparam->Array;
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
      goto LAB_00423d94;
    }
    bVar2 = param[2].field_0.i != 0;
  }
  else {
    if (param[2].field_0.field_3.Type != '\0') {
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
LAB_00423d94:
      __assert_fail(pcVar5,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                    ,0x77c,
                    "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    bVar2 = param[2].field_0.i != 0;
    if (numparam != 3) {
      if (param[3].field_0.field_3.Type == '\0') goto LAB_00423cd2;
      pcVar5 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_00423db3;
    }
    param = defaultparam->Array;
  }
  if (param[3].field_0.field_3.Type == '\0') {
LAB_00423cd2:
    pAVar3 = P_RoughMonsterSearch(pAVar3,(pVVar1->field_0).i,bVar2,param[3].field_0.i != 0);
    if (numret < 1) {
      iVar4 = 0;
    }
    else {
      if (ret == (VMReturn *)0x0) {
        __assert_fail("ret != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                      ,0x77e,
                      "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      iVar4 = 1;
      VMReturn::SetPointer(ret,pAVar3,1);
    }
    return iVar4;
  }
  pcVar5 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_00423db3:
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_maputl.cpp"
                ,0x77d,
                "int AF_AActor_RoughMonsterSearch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, RoughMonsterSearch)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(distance);
	PARAM_BOOL_DEF(onlyseekable);
	PARAM_BOOL_DEF(frontonly);
	ACTION_RETURN_OBJECT(P_RoughMonsterSearch(self, distance, onlyseekable, frontonly));
}